

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_split.cpp
# Opt level: O3

void midpt_split(ANNpointArray pa,ANNidxArray pidx,ANNorthRect *bnds,int n,int dim,int *cut_dim,
                ANNcoord *cut_val,int *n_lo)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  ANNcoord AVar7;
  int br2;
  int br1;
  double local_48;
  int local_38;
  int local_34;
  
  pdVar5 = bnds->lo;
  pdVar2 = bnds->hi;
  dVar6 = *pdVar2 - *pdVar5;
  if (1 < dim) {
    uVar4 = 1;
    do {
      dVar1 = pdVar2[uVar4] - pdVar5[uVar4];
      if (pdVar2[uVar4] - pdVar5[uVar4] <= dVar6) {
        dVar1 = dVar6;
      }
      dVar6 = dVar1;
      uVar4 = uVar4 + 1;
    } while ((uint)dim != uVar4);
  }
  if (0 < dim) {
    local_48 = -1.0;
    uVar4 = 0;
    do {
      if (dVar6 * 0.999 <= bnds->hi[uVar4] - bnds->lo[uVar4]) {
        AVar7 = annSpread(pa,pidx,n,(int)uVar4);
        if (local_48 < AVar7) {
          *cut_dim = (int)uVar4;
          local_48 = AVar7;
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)dim != uVar4);
    pdVar5 = bnds->lo;
    pdVar2 = bnds->hi;
  }
  iVar3 = *cut_dim;
  dVar6 = (pdVar5[iVar3] + pdVar2[iVar3]) * 0.5;
  *cut_val = dVar6;
  annPlaneSplit(pa,pidx,n,iVar3,dVar6,&local_34,&local_38);
  iVar3 = n / 2;
  if (iVar3 <= local_38) {
    local_38 = iVar3;
  }
  if (iVar3 < local_34) {
    local_38 = local_34;
  }
  *n_lo = local_38;
  return;
}

Assistant:

void midpt_split(ANNpointArray pa,         // point array
                 ANNidxArray pidx,         // point indices (permuted on return)
                 const ANNorthRect &bnds,  // bounding rectangle for cell
                 int n,                    // number of points
                 int dim,                  // dimension of space
                 int &cut_dim,             // cutting dimension (returned)
                 ANNcoord &cut_val,        // cutting value (returned)
                 int &n_lo)  // num of points on low side (returned)
{
    int d;

    ANNcoord max_length = bnds.hi[0] - bnds.lo[0];
    for (d = 1; d < dim; d++) {  // find length of longest box side
        ANNcoord length = bnds.hi[d] - bnds.lo[d];
        if (length > max_length) {
            max_length = length;
        }
    }
    ANNcoord max_spread = -1;  // find long side with most spread
    for (d = 0; d < dim; d++) {
        // is it among longest?
        if (double(bnds.hi[d] - bnds.lo[d]) >= (1 - ERR) * max_length) {
            // compute its spread
            ANNcoord spr = annSpread(pa, pidx, n, d);
            if (spr > max_spread) {  // is it max so far?
                max_spread = spr;
                cut_dim = d;
            }
        }
    }
    // split along cut_dim at midpoint
    cut_val = (bnds.lo[cut_dim] + bnds.hi[cut_dim]) / 2;
    // permute points accordingly
    int br1, br2;
    annPlaneSplit(pa, pidx, n, cut_dim, cut_val, br1, br2);
    //------------------------------------------------------------------
    //	On return:	pa[0..br1-1] < cut_val
    //			pa[br1..br2-1] == cut_val
    //			pa[br2..n-1] > cut_val
    //
    //	We can set n_lo to any value in the range [br1..br2].
    //	We choose split so that points are most evenly divided.
    //------------------------------------------------------------------
    if (br1 > n / 2)
        n_lo = br1;
    else if (br2 < n / 2)
        n_lo = br2;
    else
        n_lo = n / 2;
}